

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disco_test.cpp
# Opt level: O0

void __thiscall async_unit_test::async_unit_test(async_unit_test *this,service *s)

{
  service *in_RSI;
  application *in_RDI;
  allocator local_79;
  string local_78 [32];
  code *local_58;
  undefined8 local_50;
  allocator local_41;
  async_unit_test *in_stack_ffffffffffffffc0;
  member_type in_stack_ffffffffffffffc8;
  string *in_stack_ffffffffffffffd8;
  url_dispatcher *in_stack_ffffffffffffffe0;
  
  cppcms::application::application(in_RDI,in_RSI);
  *(undefined ***)in_RDI = &PTR__async_unit_test_001168f8;
  cppcms::application::dispatcher();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc0,"/single",&local_41);
  local_58 = single;
  local_50 = 0;
  cppcms::url_dispatcher::assign<async_unit_test>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  cppcms::application::dispatcher();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"/multiple",&local_79);
  cppcms::url_dispatcher::assign<async_unit_test>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  return;
}

Assistant:

async_unit_test(cppcms::service &s) : cppcms::application(s)
	{
		dispatcher().assign("/single",&async_unit_test::single,this);
		dispatcher().assign("/multiple",&async_unit_test::multiple,this);
	}